

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiID ImGui::AddContextHook(ImGuiContext *ctx,ImGuiContextHook *hook)

{
  int *piVar1;
  ImGuiContextHook *pIVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  ImGuiContextHook *__dest;
  long lVar7;
  int iVar8;
  ImGuiID IVar9;
  int iVar10;
  
  iVar6 = (ctx->Hooks).Size;
  if (iVar6 == (ctx->Hooks).Capacity) {
    if (iVar6 == 0) {
      iVar8 = 8;
    }
    else {
      iVar8 = iVar6 / 2 + iVar6;
    }
    iVar10 = iVar6 + 1;
    if (iVar6 + 1 < iVar8) {
      iVar10 = iVar8;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest = (ImGuiContextHook *)(*GImAllocatorAllocFunc)((long)iVar10 << 5,GImAllocatorUserData);
    pIVar2 = (ctx->Hooks).Data;
    if (pIVar2 != (ImGuiContextHook *)0x0) {
      memcpy(__dest,pIVar2,(long)(ctx->Hooks).Size << 5);
      pIVar2 = (ctx->Hooks).Data;
      if ((pIVar2 != (ImGuiContextHook *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar2,GImAllocatorUserData);
    }
    (ctx->Hooks).Data = __dest;
    (ctx->Hooks).Capacity = iVar10;
    iVar6 = (ctx->Hooks).Size;
  }
  else {
    __dest = (ctx->Hooks).Data;
  }
  uVar3 = *(undefined8 *)hook;
  uVar4 = *(undefined8 *)(hook + 8);
  uVar5 = *(undefined8 *)(hook + 0x18);
  *(undefined8 *)(__dest + (long)iVar6 * 0x20 + 0x10) = *(undefined8 *)(hook + 0x10);
  *(undefined8 *)(__dest + (long)iVar6 * 0x20 + 0x10 + 8) = uVar5;
  *(undefined8 *)(__dest + (long)iVar6 * 0x20) = uVar3;
  *(undefined8 *)(__dest + (long)iVar6 * 0x20 + 8) = uVar4;
  lVar7 = (long)(ctx->Hooks).Size + 1;
  (ctx->Hooks).Size = (int)lVar7;
  IVar9 = ctx->HookIdNext + 1;
  ctx->HookIdNext = IVar9;
  *(ImGuiID *)((ctx->Hooks).Data + lVar7 * 0x20 + -0x20) = IVar9;
  return ctx->HookIdNext;
}

Assistant:

ImGuiID ImGui::AddContextHook(ImGuiContext* ctx, const ImGuiContextHook* hook)
{
    ImGuiContext& g = *ctx;
    IM_ASSERT(hook->Callback != NULL && hook->HookId == 0 && hook->Type != ImGuiContextHookType_PendingRemoval_);
    g.Hooks.push_back(*hook);
    g.Hooks.back().HookId = ++g.HookIdNext;
    return g.HookIdNext;
}